

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_config.cxx
# Opt level: O0

ptr<cluster_config> nuraft::cluster_config::deserialize(buffer_serializer *bs)

{
  buffer_serializer *bs_00;
  char *pcVar1;
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  ptr<cluster_config> pVar2;
  int32 cnt;
  string user_ctx;
  byte *ctx_data;
  size_t ctx_len;
  bool ec;
  byte ec_byte;
  ulong prev_log_idx;
  ulong log_idx;
  ptr<cluster_config> *conf;
  string *in_stack_ffffffffffffff38;
  cluster_config *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int32_t iVar3;
  element_type *len;
  buffer_serializer *in_stack_ffffffffffffff60;
  buffer_serializer *in_stack_ffffffffffffff70;
  buffer_serializer *this_00;
  int local_70;
  undefined1 local_59 [33];
  char *local_38;
  ulong local_30;
  undefined1 local_22;
  uint8_t local_21;
  uint64_t local_20;
  
  len = in_RDI;
  bs_00 = (buffer_serializer *)buffer_serializer::get_u64(in_stack_ffffffffffffff70);
  local_20 = buffer_serializer::get_u64(in_stack_ffffffffffffff70);
  local_21 = buffer_serializer::get_u8(in_stack_ffffffffffffff60);
  local_22 = local_21 != '\0';
  pcVar1 = (char *)buffer_serializer::get_bytes(in_stack_ffffffffffffff60,&len->log_idx_);
  this_00 = (buffer_serializer *)local_59;
  local_38 = pcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_59 + 1),pcVar1,local_30,(allocator *)this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_59);
  local_70 = buffer_serializer::get_i32(this_00);
  iVar3 = local_70;
  cs_new<nuraft::cluster_config,unsigned_long&,unsigned_long&,bool&>
            ((unsigned_long *)CONCAT44(local_70,in_stack_ffffffffffffff48),
             &in_stack_ffffffffffffff40->log_idx_,(bool *)in_stack_ffffffffffffff38);
  while (0 < local_70) {
    this = std::
           __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x168b84);
    in_stack_ffffffffffffff40 = (cluster_config *)get_servers_abi_cxx11_(this);
    srv_config::deserialize(bs_00);
    std::__cxx11::
    list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back((list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)in_RDI,(value_type *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
    std::shared_ptr<nuraft::srv_config>::~shared_ptr((shared_ptr<nuraft::srv_config> *)0x168bc2);
    local_70 = local_70 + -1;
  }
  std::__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x168c25);
  set_user_ctx(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  std::__cxx11::string::~string((string *)(local_59 + 1));
  pVar2.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar2.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>._M_ptr = len;
  return (ptr<cluster_config>)
         pVar2.super___shared_ptr<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<cluster_config> cluster_config::deserialize(buffer_serializer& bs) {
    ulong log_idx = bs.get_u64();
    ulong prev_log_idx = bs.get_u64();

    byte ec_byte = bs.get_u8();
    bool ec = ec_byte ? true : false;

    size_t ctx_len;
    const byte* ctx_data = (const byte*)bs.get_bytes(ctx_len);
    std::string user_ctx = std::string((const char*)ctx_data, ctx_len);

    int32 cnt = bs.get_i32();
    ptr<cluster_config> conf = cs_new<cluster_config>(log_idx, prev_log_idx, ec);
    while (cnt -- > 0) {
        conf->get_servers().push_back(srv_config::deserialize(bs));
    }

    conf->set_user_ctx(user_ctx);

    return conf;
}